

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void ImportBlock(uint8_t *src,int src_stride,uint8_t *dst,int w,int h,int size)

{
  int iVar1;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  int in_R8D;
  int in_R9D;
  int i;
  undefined4 local_28;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_28 = 0; iVar1 = in_R8D, local_28 < in_R8D; local_28 = local_28 + 1) {
    memcpy(local_18,local_8,(long)in_ECX);
    if (in_ECX < in_R9D) {
      memset((void *)((long)local_18 + (long)in_ECX),
             (uint)*(byte *)((long)local_18 + (long)(in_ECX + -1)),(long)(in_R9D - in_ECX));
    }
    local_18 = (void *)((long)local_18 + 0x20);
    local_8 = (void *)((long)local_8 + (long)in_ESI);
  }
  while (local_28 = iVar1, local_28 < in_R9D) {
    memcpy(local_18,(void *)((long)local_18 + -0x20),(long)in_R9D);
    local_18 = (void *)((long)local_18 + 0x20);
    iVar1 = local_28 + 1;
  }
  return;
}

Assistant:

static void ImportBlock(const uint8_t* src, int src_stride,
                        uint8_t* dst, int w, int h, int size) {
  int i;
  for (i = 0; i < h; ++i) {
    memcpy(dst, src, w);
    if (w < size) {
      memset(dst + w, dst[w - 1], size - w);
    }
    dst += BPS;
    src += src_stride;
  }
  for (i = h; i < size; ++i) {
    memcpy(dst, dst - BPS, size);
    dst += BPS;
  }
}